

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMLCPSolver.cpp
# Opt level: O2

void __thiscall btMLCPSolver::createMLCP(btMLCPSolver *this,btContactSolverInfo *infoGlobal)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint rows;
  btSolverConstraint **ppbVar4;
  float *pfVar5;
  float *pfVar6;
  btSolverConstraint *pbVar7;
  btSolverBody *pbVar8;
  btRigidBody *pbVar9;
  float *pfVar10;
  int iVar11;
  int c;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined1 *puVar19;
  float *pfVar20;
  ulong uVar21;
  int r;
  long lVar22;
  int iVar23;
  bool bVar24;
  float fVar25;
  CProfileSample __profile;
  btMatrixX<float> local_88;
  
  uVar3 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_size;
  rows = (this->m_allConstraintPtrArray).m_size;
  btVectorX<float>::resize(&this->m_b,rows);
  if ((infoGlobal->super_btContactSolverInfoData).m_splitImpulse != 0) {
    btVectorX<float>::resize(&this->m_bSplit,rows);
  }
  btVectorX<float>::setZero(&this->m_bSplit);
  btVectorX<float>::setZero(&this->m_b);
  ppbVar4 = (this->m_allConstraintPtrArray).m_data;
  pfVar5 = (this->m_b).m_storage.m_data;
  pfVar6 = (this->m_bSplit).m_storage.m_data;
  iVar18 = (infoGlobal->super_btContactSolverInfoData).m_splitImpulse;
  uVar14 = 0;
  uVar21 = 0;
  if (0 < (int)rows) {
    uVar21 = (ulong)rows;
  }
  for (; uVar21 != uVar14; uVar14 = uVar14 + 1) {
    pbVar7 = ppbVar4[uVar14];
    fVar25 = pbVar7->m_jacDiagABInv;
    if (((fVar25 != 0.0) || (NAN(fVar25))) && (pfVar5[uVar14] = pbVar7->m_rhs / fVar25, iVar18 != 0)
       ) {
      pfVar6[uVar14] = pbVar7->m_rhsPenetration / pbVar7->m_jacDiagABInv;
    }
  }
  if ((createMLCP(btContactSolverInfo_const&)::Minv == '\0') &&
     (iVar18 = __cxa_guard_acquire(&createMLCP(btContactSolverInfo_const&)::Minv), iVar18 != 0)) {
    btMatrixX<float>::btMatrixX(&createMLCP::Minv);
    __cxa_atexit(btMatrixX<float>::~btMatrixX,&createMLCP::Minv,&__dso_handle);
    __cxa_guard_release(&createMLCP(btContactSolverInfo_const&)::Minv);
  }
  iVar11 = uVar3 * 6;
  btMatrixX<float>::resize(&createMLCP::Minv,iVar11,iVar11);
  btMatrixX<float>::setZero(&createMLCP::Minv);
  pfVar5 = createMLCP::Minv.m_storage.m_data;
  iVar18 = createMLCP::Minv.m_cols;
  pbVar8 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_data;
  iVar13 = createMLCP::Minv.m_cols + 1;
  uVar15 = 0;
  uVar14 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar14 = uVar15;
  }
  iVar23 = createMLCP::Minv.m_cols * 3 + 3;
  iVar16 = createMLCP::Minv.m_cols * 6;
  for (; uVar15 != uVar14; uVar15 = uVar15 + 1) {
    iVar17 = (int)uVar15 * 6;
    pfVar5[iVar13 * iVar17] = pbVar8[uVar15].m_invMass.m_floats[0];
    pfVar5[(iVar17 + 1) * iVar13] = pbVar8[uVar15].m_invMass.m_floats[1];
    pfVar5[(iVar17 + 2) * iVar13] = pbVar8[uVar15].m_invMass.m_floats[2];
    pbVar9 = pbVar8[uVar15].m_originalBody;
    puVar19 = &(pbVar9->super_btCollisionObject).field_0x14c;
    iVar17 = iVar23;
    for (lVar22 = 0; lVar22 != 3; lVar22 = lVar22 + 1) {
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        if (pbVar9 == (btRigidBody *)0x0) {
          fVar25 = 0.0;
        }
        else {
          fVar25 = *(float *)(puVar19 + lVar12 * 4);
        }
        pfVar5[iVar17 + (int)lVar12] = fVar25;
      }
      iVar17 = iVar17 + iVar18;
      puVar19 = puVar19 + 0x10;
    }
    createMLCP::Minv.m_setElemOperations = createMLCP::Minv.m_setElemOperations + 0xc;
    iVar23 = iVar23 + iVar16 + 6;
  }
  if ((createMLCP(btContactSolverInfo_const&)::J == '\0') &&
     (iVar18 = __cxa_guard_acquire(&createMLCP(btContactSolverInfo_const&)::J), iVar18 != 0)) {
    btMatrixX<float>::btMatrixX(&createMLCP::J);
    __cxa_atexit(btMatrixX<float>::~btMatrixX,&createMLCP::J,&__dso_handle);
    __cxa_guard_release(&createMLCP(btContactSolverInfo_const&)::J);
  }
  btMatrixX<float>::resize(&createMLCP::J,rows,iVar11);
  btMatrixX<float>::setZero(&createMLCP::J);
  btVectorX<float>::resize(&this->m_lo,rows);
  btVectorX<float>::resize(&this->m_hi,rows);
  pfVar10 = createMLCP::J.m_storage.m_data;
  iVar11 = createMLCP::J.m_cols;
  ppbVar4 = (this->m_allConstraintPtrArray).m_data;
  pbVar8 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_data;
  pfVar5 = (this->m_lo).m_storage.m_data;
  pfVar6 = (this->m_hi).m_storage.m_data;
  lVar22 = (long)createMLCP::J.m_cols;
  iVar18 = 5;
  pfVar20 = createMLCP::J.m_storage.m_data;
  iVar13 = createMLCP::J.m_setElemOperations;
  for (uVar14 = 0; uVar21 != uVar14; uVar14 = uVar14 + 1) {
    pbVar7 = ppbVar4[uVar14];
    pfVar5[uVar14] = pbVar7->m_lowerLimit;
    pfVar6[uVar14] = pbVar7->m_upperLimit;
    iVar16 = pbVar7->m_solverBodyIdA;
    iVar23 = pbVar7->m_solverBodyIdB;
    if (pbVar8[iVar16].m_originalBody != (btRigidBody *)0x0) {
      iVar17 = iVar16 * 6;
      pfVar20[(long)iVar16 * 6] = (pbVar7->m_contactNormal1).m_floats[0];
      pfVar10[iVar18 + -4 + iVar17] = (pbVar7->m_contactNormal1).m_floats[1];
      pfVar10[iVar18 + -3 + iVar17] = (pbVar7->m_contactNormal1).m_floats[2];
      pfVar10[iVar18 + -2 + iVar17] = (pbVar7->m_relpos1CrossNormal).m_floats[0];
      pfVar10[iVar18 + -1 + iVar17] = (pbVar7->m_relpos1CrossNormal).m_floats[1];
      iVar13 = iVar13 + 6;
      createMLCP::J.m_setElemOperations = iVar13;
      pfVar10[iVar18 + iVar17] = (pbVar7->m_relpos1CrossNormal).m_floats[2];
    }
    if (pbVar8[iVar23].m_originalBody != (btRigidBody *)0x0) {
      iVar23 = iVar23 * 6;
      pfVar20[iVar23] = (pbVar7->m_contactNormal2).m_floats[0];
      pfVar10[iVar18 + -4 + iVar23] = (pbVar7->m_contactNormal2).m_floats[1];
      pfVar10[iVar18 + -3 + iVar23] = (pbVar7->m_contactNormal2).m_floats[2];
      pfVar10[iVar18 + -2 + iVar23] = (pbVar7->m_relpos2CrossNormal).m_floats[0];
      pfVar10[iVar18 + -1 + iVar23] = (pbVar7->m_relpos2CrossNormal).m_floats[1];
      iVar13 = iVar13 + 6;
      createMLCP::J.m_setElemOperations = iVar13;
      pfVar10[iVar18 + iVar23] = (pbVar7->m_relpos2CrossNormal).m_floats[2];
    }
    pfVar20 = pfVar20 + lVar22;
    iVar18 = iVar18 + iVar11;
  }
  if ((createMLCP(btContactSolverInfo_const&)::J_transpose == '\0') &&
     (iVar18 = __cxa_guard_acquire(&createMLCP(btContactSolverInfo_const&)::J_transpose),
     iVar18 != 0)) {
    btMatrixX<float>::btMatrixX(&createMLCP::J_transpose);
    __cxa_atexit(btMatrixX<float>::~btMatrixX,&createMLCP::J_transpose,&__dso_handle);
    __cxa_guard_release(&createMLCP(btContactSolverInfo_const&)::J_transpose);
  }
  btMatrixX<float>::transpose(&local_88,&createMLCP::J);
  btMatrixX<float>::operator=(&createMLCP::J_transpose,&local_88);
  btMatrixX<float>::~btMatrixX(&local_88);
  if ((createMLCP(btContactSolverInfo_const&)::tmp == '\0') &&
     (iVar18 = __cxa_guard_acquire(&createMLCP(btContactSolverInfo_const&)::tmp), iVar18 != 0)) {
    btMatrixX<float>::btMatrixX(&createMLCP::tmp);
    __cxa_atexit(btMatrixX<float>::~btMatrixX,&createMLCP::tmp,&__dso_handle);
    __cxa_guard_release(&createMLCP(btContactSolverInfo_const&)::tmp);
  }
  CProfileManager::Start_Profile("J*Minv");
  btMatrixX<float>::operator*(&local_88,&createMLCP::J,&createMLCP::Minv);
  btMatrixX<float>::operator=(&createMLCP::tmp,&local_88);
  btMatrixX<float>::~btMatrixX(&local_88);
  CProfileSample::~CProfileSample(&__profile);
  CProfileManager::Start_Profile("J*tmp");
  btMatrixX<float>::operator*(&local_88,&createMLCP::tmp,&createMLCP::J_transpose);
  btMatrixX<float>::operator=(&this->m_A,&local_88);
  btMatrixX<float>::~btMatrixX(&local_88);
  CProfileSample::~CProfileSample(&__profile);
  uVar3 = (this->m_A).m_rows;
  iVar18 = (this->m_A).m_cols;
  pfVar5 = (this->m_A).m_storage.m_data;
  iVar11 = (this->m_A).m_setElemOperations;
  uVar21 = 0;
  uVar14 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar14 = uVar21;
  }
  while( true ) {
    iVar11 = iVar11 + 1;
    bVar24 = uVar14 == 0;
    uVar14 = uVar14 - 1;
    if (bVar24) break;
    iVar13 = (int)uVar21;
    fVar25 = this->m_cfm;
    fVar1 = (infoGlobal->super_btContactSolverInfoData).m_timeStep;
    fVar2 = pfVar5[iVar13];
    (this->m_A).m_setElemOperations = iVar11;
    pfVar5[iVar13] = fVar25 / fVar1 + fVar2;
    uVar21 = (ulong)(uint)(iVar13 + iVar18 + 1);
  }
  btVectorX<float>::resize(&this->m_x,rows);
  if ((infoGlobal->super_btContactSolverInfoData).m_splitImpulse == 0) {
    bVar24 = true;
  }
  else {
    btVectorX<float>::resize(&this->m_xSplit,rows);
    bVar24 = (infoGlobal->super_btContactSolverInfoData).m_splitImpulse == 0;
  }
  uVar3 = (this->m_allConstraintPtrArray).m_size;
  ppbVar4 = (this->m_allConstraintPtrArray).m_data;
  pfVar5 = (this->m_x).m_storage.m_data;
  pfVar6 = (this->m_xSplit).m_storage.m_data;
  uVar21 = 0;
  uVar14 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar14 = uVar21;
  }
  for (; uVar14 != uVar21; uVar21 = uVar21 + 1) {
    pbVar7 = ppbVar4[uVar21];
    pfVar5[uVar21] = pbVar7->m_appliedImpulse;
    if (!bVar24) {
      pfVar6[uVar21] = pbVar7->m_appliedPushImpulse;
    }
  }
  return;
}

Assistant:

void btMLCPSolver::createMLCP(const btContactSolverInfo& infoGlobal)
{
	int numBodies = this->m_tmpSolverBodyPool.size();
	int numConstraintRows = m_allConstraintPtrArray.size();

	m_b.resize(numConstraintRows);
	if (infoGlobal.m_splitImpulse)
		m_bSplit.resize(numConstraintRows);
 
	m_bSplit.setZero();
	m_b.setZero();

	for (int i=0;i<numConstraintRows ;i++)
	{
		if (m_allConstraintPtrArray[i]->m_jacDiagABInv)
		{
			m_b[i]=m_allConstraintPtrArray[i]->m_rhs/m_allConstraintPtrArray[i]->m_jacDiagABInv;
			if (infoGlobal.m_splitImpulse)
				m_bSplit[i] = m_allConstraintPtrArray[i]->m_rhsPenetration/m_allConstraintPtrArray[i]->m_jacDiagABInv;
		}
	}
 
	static btMatrixXu Minv;
	Minv.resize(6*numBodies,6*numBodies);
	Minv.setZero();
	for (int i=0;i<numBodies;i++)
	{
		const btSolverBody& rb = m_tmpSolverBodyPool[i];
		const btVector3& invMass = rb.m_invMass;
		setElem(Minv,i*6+0,i*6+0,invMass[0]);
		setElem(Minv,i*6+1,i*6+1,invMass[1]);
		setElem(Minv,i*6+2,i*6+2,invMass[2]);
		btRigidBody* orgBody = m_tmpSolverBodyPool[i].m_originalBody;
 
		for (int r=0;r<3;r++)
			for (int c=0;c<3;c++)
				setElem(Minv,i*6+3+r,i*6+3+c,orgBody? orgBody->getInvInertiaTensorWorld()[r][c] : 0);
	}
 
	static btMatrixXu J;
	J.resize(numConstraintRows,6*numBodies);
	J.setZero();
 
	m_lo.resize(numConstraintRows);
	m_hi.resize(numConstraintRows);
 
	for (int i=0;i<numConstraintRows;i++)
	{

		m_lo[i] = m_allConstraintPtrArray[i]->m_lowerLimit;
		m_hi[i] = m_allConstraintPtrArray[i]->m_upperLimit;
 
		int bodyIndex0 = m_allConstraintPtrArray[i]->m_solverBodyIdA;
		int bodyIndex1 = m_allConstraintPtrArray[i]->m_solverBodyIdB;
		if (m_tmpSolverBodyPool[bodyIndex0].m_originalBody)
		{
			setElem(J,i,6*bodyIndex0+0,m_allConstraintPtrArray[i]->m_contactNormal1[0]);
			setElem(J,i,6*bodyIndex0+1,m_allConstraintPtrArray[i]->m_contactNormal1[1]);
			setElem(J,i,6*bodyIndex0+2,m_allConstraintPtrArray[i]->m_contactNormal1[2]);
			setElem(J,i,6*bodyIndex0+3,m_allConstraintPtrArray[i]->m_relpos1CrossNormal[0]);
			setElem(J,i,6*bodyIndex0+4,m_allConstraintPtrArray[i]->m_relpos1CrossNormal[1]);
			setElem(J,i,6*bodyIndex0+5,m_allConstraintPtrArray[i]->m_relpos1CrossNormal[2]);
		}
		if (m_tmpSolverBodyPool[bodyIndex1].m_originalBody)
		{
			setElem(J,i,6*bodyIndex1+0,m_allConstraintPtrArray[i]->m_contactNormal2[0]);
			setElem(J,i,6*bodyIndex1+1,m_allConstraintPtrArray[i]->m_contactNormal2[1]);
			setElem(J,i,6*bodyIndex1+2,m_allConstraintPtrArray[i]->m_contactNormal2[2]);
			setElem(J,i,6*bodyIndex1+3,m_allConstraintPtrArray[i]->m_relpos2CrossNormal[0]);
			setElem(J,i,6*bodyIndex1+4,m_allConstraintPtrArray[i]->m_relpos2CrossNormal[1]);
			setElem(J,i,6*bodyIndex1+5,m_allConstraintPtrArray[i]->m_relpos2CrossNormal[2]);
		}
	}
 
	static btMatrixXu J_transpose;
	J_transpose= J.transpose();

	static btMatrixXu tmp;

	{
		{
			BT_PROFILE("J*Minv");
			tmp = J*Minv;

		}
		{
			BT_PROFILE("J*tmp");
			m_A = tmp*J_transpose;
		}
	}

	if (1)
	{
		// add cfm to the diagonal of m_A
		for ( int i=0; i<m_A.rows(); ++i) 
		{
			m_A.setElem(i,i,m_A(i,i)+ m_cfm / infoGlobal.m_timeStep);
		}
	}

	m_x.resize(numConstraintRows);
	if (infoGlobal.m_splitImpulse)
		m_xSplit.resize(numConstraintRows);
//	m_x.setZero();

	for (int i=0;i<m_allConstraintPtrArray.size();i++)
	{
		const btSolverConstraint& c = *m_allConstraintPtrArray[i];
		m_x[i]=c.m_appliedImpulse;
		if (infoGlobal.m_splitImpulse)
			m_xSplit[i] = c.m_appliedPushImpulse;
	}

}